

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int set_gpass_option(mg_context *phys_ctx,mg_domain_context *dom_ctx)

{
  void *pvVar1;
  int iVar2;
  mg_connection *conn;
  int *piVar3;
  char *pcVar4;
  undefined1 local_a38 [8];
  mg_connection fc;
  char *path;
  mg_file file;
  mg_domain_context *dom_ctx_local;
  mg_context *phys_ctx_local;
  
  if (phys_ctx == (mg_context *)0x0) {
    phys_ctx_local._4_4_ = 0;
  }
  else {
    file.access.fp = (FILE *)dom_ctx;
    memset(&path,0,0x28);
    if (file.access.fp == (FILE *)0x0) {
      file.access.fp = (FILE *)&phys_ctx->dd;
    }
    fc.tls_user_ptr = file.access.fp[1]._IO_save_base;
    if ((char *)fc.tls_user_ptr != (char *)0x0) {
      conn = fake_connection((mg_connection *)local_a38,phys_ctx);
      iVar2 = mg_stat(conn,(char *)fc.tls_user_ptr,(mg_file_stat *)&path);
      pvVar1 = fc.tls_user_ptr;
      if (iVar2 == 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,phys_ctx,"set_gpass_option",0x44f3,"Cannot open %s: %s",
                   pvVar1,pcVar4);
        return 0;
      }
    }
    phys_ctx_local._4_4_ = 1;
  }
  return phys_ctx_local._4_4_;
}

Assistant:

static int
set_gpass_option(struct mg_context *phys_ctx, struct mg_domain_context *dom_ctx)
{
	if (phys_ctx) {
		struct mg_file file = STRUCT_FILE_INITIALIZER;
		const char *path;
		struct mg_connection fc;
		if (!dom_ctx) {
			dom_ctx = &(phys_ctx->dd);
		}
		path = dom_ctx->config[GLOBAL_PASSWORDS_FILE];
		if ((path != NULL)
		    && !mg_stat(fake_connection(&fc, phys_ctx), path, &file.stat)) {
			mg_cry_ctx_internal(phys_ctx,
			                    "Cannot open %s: %s",
			                    path,
			                    strerror(ERRNO));
			return 0;
		}
		return 1;
	}
	return 0;
}